

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O1

uint16_t __thiscall AmsRouter::OpenPort(AmsRouter *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  undefined7 extraout_var;
  uint16_t uVar4;
  ulong uVar5;
  AmsPort *this_00;
  bool bVar6;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  this_00 = (AmsPort *)&this->ports;
  uVar5 = 0;
  bVar6 = false;
  do {
    bVar1 = AmsPort::IsOpen(this_00);
    uVar2 = (uint16_t)CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      uVar2 = AmsPort::Open(this_00,(short)uVar5 + 30000);
      break;
    }
    bVar6 = 0x7e < uVar5;
    uVar5 = uVar5 + 1;
    this_00 = this_00 + 1;
  } while (uVar5 != 0x80);
  uVar4 = 0;
  if (!bVar6) {
    uVar4 = uVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return uVar4;
}

Assistant:

uint16_t AmsRouter::OpenPort()
{
    std::lock_guard<std::recursive_mutex> lock(mutex);

    for (uint16_t i = 0; i < NUM_PORTS_MAX; ++i) {
        if (!ports[i].IsOpen()) {
            return ports[i].Open(PORT_BASE + i);
        }
    }
    return 0;
}